

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O1

int lift_object(obj *obj,obj *container,long *cnt_p,boolean telekinesis)

{
  long lVar1;
  undefined1 auVar2 [16];
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  obj *poVar11;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  char *local_280;
  char *local_270;
  uint local_238;
  undefined1 uStack_234;
  undefined2 uStack_233;
  undefined4 uStack_231;
  undefined4 uStack_22d;
  undefined4 uStack_229;
  char obj_nambuf [256];
  
  if (obj->otyp == 0x210) {
    return 1;
  }
  if (obj->otyp == 0x214) {
    if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
      pcVar7 = body_part(6);
      pcVar8 = xname(obj);
      pline("You cannot get your %s around this %s.",pcVar7,pcVar8);
      return -1;
    }
    if (((youmonst.data)->mflags2 & 0x8000000) != 0) {
      return 1;
    }
  }
  bVar24 = true;
  bVar23 = true;
  if (container != &zeroobj && container != (obj *)0x0) {
    bVar23 = container->where != '\x03';
  }
  lVar1 = *cnt_p;
  if (container != &zeroobj && container != (obj *)0x0) {
    bVar24 = container->otyp != 0xe0;
  }
  cVar3 = obj->oclass;
  lVar9 = money_cnt(invent);
  uVar17 = obj->owt;
  iVar6 = obj->quan;
  iVar4 = max_capacity();
  if (lVar1 != iVar6) {
    obj->quan = (int)lVar1;
    uVar5 = weight(obj);
    obj->owt = uVar5;
  }
  uVar5 = obj->owt;
  iVar15 = uVar5 + iVar4;
  if (!bVar23) {
    if (!bVar24) {
      if ((*(uint *)&container->field_0x4a & 1) == 0) {
        if ((*(uint *)&container->field_0x4a & 2) == 0) {
          uVar5 = uVar5 + 1 >> 1;
        }
        else {
          uVar5 = uVar5 + 3 >> 2;
        }
      }
      else {
        uVar5 = uVar5 * 2;
      }
    }
    iVar15 = iVar15 - uVar5;
  }
  if (cVar3 == '\f') {
    uVar13 = (SUB168(SEXT816(lVar9 + 0x32) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar9) - 0x32;
    uVar18 = (SUB168(SEXT816(lVar1 + 0x32) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar1) - 0x32;
    auVar2 = SEXT816(lVar9 + lVar1 + 0x32) * ZEXT816(0xa3d70a3d70a3d70b);
    iVar15 = iVar15 + ((int)(auVar2._8_8_ >> 6) - (auVar2._12_4_ >> 0x1f)) +
                      ((int)(uVar18 >> 6) - (int)((long)uVar18 >> 0x3f)) +
                      ((int)(uVar13 >> 6) - (int)((long)uVar13 >> 0x3f));
  }
  if (lVar1 != iVar6) {
    obj->quan = iVar6;
    obj->owt = uVar17;
  }
  lVar21 = lVar1;
  iVar16 = iVar15;
  if (-1 < iVar15) {
    if (cVar3 == '\f') {
      lVar20 = lVar9 + 0x32;
      uVar13 = (SUB168(SEXT816(lVar20) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar9) - 0x32;
      uVar5 = ((int)(uVar13 >> 6) - (int)((long)uVar13 >> 0x3f)) + iVar4;
      if (bVar23) {
        lVar19 = ((long)(int)uVar5 * -100 - lVar9) + -0x33;
      }
      else {
        lVar19 = 0x31;
        if (0x31 < lVar9 % 100) {
          lVar19 = 0x95;
        }
        lVar19 = lVar19 - lVar9 % 100;
        iVar16 = 0;
        if (lVar19 <= lVar1) {
          iVar16 = 0;
          do {
            obj->quan = (int)lVar19;
            uVar13 = SUB168(SEXT816(lVar19 + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) + lVar19 + 0x32
            ;
            uVar22 = (int)(uVar13 >> 6) - (int)((long)uVar13 >> 0x3f);
            obj->owt = uVar22;
            auVar2 = SEXT816(lVar20 + lVar19) * ZEXT816(0xa3d70a3d70a3d70b);
            if (!bVar24) {
              if ((*(uint *)&container->field_0x4a & 1) == 0) {
                if ((*(uint *)&container->field_0x4a & 2) == 0) {
                  uVar22 = uVar22 + 1 >> 1;
                }
                else {
                  uVar22 = uVar22 + 3 >> 2;
                }
              }
              else {
                uVar22 = uVar22 * 2;
              }
            }
            iVar14 = ((int)(auVar2._8_8_ >> 6) - (auVar2._12_4_ >> 0x1f)) - uVar22;
          } while ((iVar14 <= (int)~uVar5) &&
                  (lVar19 = lVar19 + 100, iVar16 = iVar14, lVar19 <= lVar1));
        }
        uVar5 = uVar5 - iVar16;
        lVar19 = lVar19 + -100;
      }
      lVar10 = lVar1;
      if (lVar19 < lVar1) {
        lVar10 = lVar19;
      }
      lVar21 = 0;
      if (-1 < lVar19) {
        lVar21 = lVar10;
      }
      auVar2 = SEXT816(lVar20 + lVar21) * ZEXT816(0xa3d70a3d70a3d70b);
      iVar16 = ((int)(auVar2._8_8_ >> 6) - (auVar2._12_4_ >> 0x1f)) + uVar5;
    }
    else if ((1 < lVar1) || ((lVar21 = 0, lVar1 == 1 && (1 < obj->quan)))) {
      lVar20 = 1;
      do {
        obj->quan = (int)lVar20;
        uVar5 = weight(obj);
        obj->owt = uVar5;
        if (!bVar23) {
          uVar22 = uVar5;
          if (!bVar24) {
            if ((*(uint *)&container->field_0x4a & 1) == 0) {
              if ((*(uint *)&container->field_0x4a & 2) == 0) {
                uVar22 = uVar5 + 1 >> 1;
              }
              else {
                uVar22 = uVar5 + 3 >> 2;
              }
            }
            else {
              uVar22 = uVar5 * 2;
            }
          }
          uVar5 = uVar5 - uVar22;
        }
        iVar14 = uVar5 + iVar4;
        lVar21 = lVar20;
      } while ((iVar14 < 0) &&
              (lVar21 = lVar20 + 1, bVar25 = lVar20 != lVar1, lVar20 = lVar21, iVar16 = iVar14,
              bVar25));
      lVar21 = lVar21 + -1;
    }
    obj->quan = iVar6;
    obj->owt = uVar17;
    if (lVar21 < lVar1) {
      pcVar7 = doname(obj);
      strcpy(obj_nambuf,pcVar7);
      if (container == (obj *)0x0) {
        local_238 = 0x6e69796c;
        uStack_234 = 0x67;
        uStack_233 = 0x6820;
        uStack_231 = 0x657265;
        pcVar7 = "acquire";
        if (telekinesis == '\0') {
          pcVar7 = "lift";
        }
      }
      else {
        if (container == &zeroobj) {
          local_238 = 0x74206e69;
          uStack_234 = 0x68;
          uStack_233 = 0x2065;
          uStack_231 = 0x6967616d;
          uStack_22d = 0x68632063;
          uStack_229 = 0x747365;
        }
        else {
          pcVar7 = xname(container);
          pcVar7 = the(pcVar7);
          sprintf((char *)&local_238,"in %s",pcVar7);
        }
        pcVar7 = "carry";
      }
    }
    else {
      local_238 = local_238 & 0xffffff00;
      obj_nambuf[0] = '\0';
      pcVar7 = "";
    }
    if (lVar21 < 1) {
      if (container == (obj *)0x0) {
        uStack_234 = 0;
        local_238 = 0x65726568;
      }
      if (invent == (obj *)0x0 && lVar9 == 0) {
        pcVar8 = "even one ";
        if (obj->quan == 1) {
          pcVar8 = "it ";
        }
        local_270 = "";
        local_280 = "is too heavy for you to ";
      }
      else {
        local_270 = " any more";
        local_280 = "";
        pcVar8 = "you cannot ";
      }
      pcVar12 = otense(obj,"are");
      lVar21 = 0;
      pline("There %s %s %s, but %s%s%s%s.",pcVar12,obj_nambuf,&local_238,pcVar8,local_280,pcVar7,
            local_270);
      iVar16 = iVar15;
    }
    else if (lVar21 < lVar1) {
      pcVar8 = "some";
      if (lVar21 == 1) {
        pcVar8 = "one";
      }
      pline("You can only %s %s of the %s %s.",pcVar7,pcVar8,obj_nambuf,&local_238);
    }
  }
  *cnt_p = lVar21;
  uVar17 = 0xffffffff;
  if (0 < lVar21) {
    iVar6 = inv_cnt();
    if ((iVar6 < 0x34) || (poVar11 = merge_choice(invent,obj), poVar11 != (obj *)0x0)) {
      iVar15 = near_capacity();
      iVar6 = flags.pickup_burden;
      if (flags.pickup_burden < iVar15) {
        iVar6 = iVar15;
      }
      iVar4 = calc_capacity(iVar16 - iVar4);
      uVar17 = 1;
      if ((iVar6 < iVar4) && (uVar17 = 0, telekinesis == '\0')) {
        pcVar7 = "You have a little trouble lifting";
        if (iVar4 == 3) {
          pcVar7 = "You have much trouble lifting";
        }
        iVar6 = obj->quan;
        obj->quan = (int)*cnt_p;
        pcVar8 = "You have extreme difficulty lifting";
        if (iVar4 < 4) {
          pcVar8 = pcVar7;
        }
        strcpy(obj_nambuf,pcVar8);
        pcVar7 = eos(obj_nambuf);
        pcVar8 = doname(obj);
        pcVar12 = simple_typename((int)obj->otyp);
        pcVar12 = an(pcVar12);
        pcVar8 = safe_qbuf(obj_nambuf,0xd,pcVar8,pcVar12,"something");
        sprintf(pcVar7," %s. Continue?",pcVar8);
        obj->quan = iVar6;
        cVar3 = yn_function(obj_nambuf,"ynq",'q');
        uVar17 = 0xffffffff;
        if (cVar3 != 'q') {
          uVar17 = (uint)(cVar3 != 'n');
        }
      }
    }
    else {
      pline("Your knapsack cannot accommodate any more items.");
    }
  }
  if (((container == (obj *)0x0) && ((int)uVar17 < 1)) && (obj->otyp == 0x155)) {
    obj->spe = '\0';
  }
  return uVar17;
}

Assistant:

static int lift_object(struct obj *obj, struct obj *container,
		       long *cnt_p, boolean telekinesis)
{
    int result, old_wt, new_wt, prev_encumbr, next_encumbr;

    if (obj->otyp == BOULDER && In_sokoban(&u.uz)) {
	pline("You cannot get your %s around this %s.",
			body_part(HAND), xname(obj));
	return -1;
    }
    if (obj->otyp == LOADSTONE ||
	    (obj->otyp == BOULDER && throws_rocks(youmonst.data)))
	return 1;		/* lift regardless of current situation */

    *cnt_p = carry_count(obj, container, *cnt_p, telekinesis, &old_wt, &new_wt);
    if (*cnt_p < 1L) {
	result = -1;	/* nothing lifted */
    } else if (inv_cnt() >= 52 && !merge_choice(invent, obj)) {
	pline("Your knapsack cannot accommodate any more items.");
	result = -1;	/* nothing lifted */
    } else {
	result = 1;
	prev_encumbr = near_capacity();
	if (prev_encumbr < flags.pickup_burden)
		prev_encumbr = flags.pickup_burden;
	next_encumbr = calc_capacity(new_wt - old_wt);
	if (next_encumbr > prev_encumbr) {
	    if (telekinesis) {
		result = 0;	/* don't lift */
	    } else {
		char qbuf[BUFSZ];
		long savequan = obj->quan;

		obj->quan = *cnt_p;
		strcpy(qbuf,
			(next_encumbr > HVY_ENCUMBER) ? overloadmsg :
			(next_encumbr > MOD_ENCUMBER) ? nearloadmsg :
			moderateloadmsg);
		sprintf(eos(qbuf), " %s. Continue?",
			safe_qbuf(qbuf, sizeof(" . Continue?"),
				doname(obj), an(simple_typename(obj->otyp)), "something"));
		obj->quan = savequan;
		switch (ynq(qbuf)) {
		    case 'q':  result = -1; break;
		    case 'n':  result =  0; break;
		    default:   break;	/* 'y' => result == 1 */
		}
	    }
	}
    }

    if (obj->otyp == SCR_SCARE_MONSTER && result <= 0 && !container)
	obj->spe = 0;
    return result;
}